

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O2

int mbedtls_md5_self_test(int verbose)

{
  uint uVar1;
  uchar (*pauVar2) [16];
  long lVar3;
  uchar (*input) [81];
  undefined1 auVar4 [16];
  uchar md5sum [16];
  
  uVar1 = 1;
  pauVar2 = md5_test_sum;
  input = md5_test_buf;
  lVar3 = 0;
  while( true ) {
    if (lVar3 == 0x38) {
      if (verbose != 0) {
        putchar(10);
      }
      return 0;
    }
    if (verbose != 0) {
      printf("  MD5 test #%d: ",(ulong)uVar1);
    }
    mbedtls_md5_ret(*input,*(size_t *)((long)md5_test_buflen + lVar3),md5sum);
    auVar4[0] = -((*pauVar2)[0] == md5sum[0]);
    auVar4[1] = -((*pauVar2)[1] == md5sum[1]);
    auVar4[2] = -((*pauVar2)[2] == md5sum[2]);
    auVar4[3] = -((*pauVar2)[3] == md5sum[3]);
    auVar4[4] = -((*pauVar2)[4] == md5sum[4]);
    auVar4[5] = -((*pauVar2)[5] == md5sum[5]);
    auVar4[6] = -((*pauVar2)[6] == md5sum[6]);
    auVar4[7] = -((*pauVar2)[7] == md5sum[7]);
    auVar4[8] = -((*pauVar2)[8] == md5sum[8]);
    auVar4[9] = -((*pauVar2)[9] == md5sum[9]);
    auVar4[10] = -((*pauVar2)[10] == md5sum[10]);
    auVar4[0xb] = -((*pauVar2)[0xb] == md5sum[0xb]);
    auVar4[0xc] = -((*pauVar2)[0xc] == md5sum[0xc]);
    auVar4[0xd] = -((*pauVar2)[0xd] == md5sum[0xd]);
    auVar4[0xe] = -((*pauVar2)[0xe] == md5sum[0xe]);
    auVar4[0xf] = -((*pauVar2)[0xf] == md5sum[0xf]);
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe | (ushort)(auVar4[0xf] >> 7) << 0xf)
        != 0xffff) break;
    if (verbose != 0) {
      puts("passed");
    }
    uVar1 = uVar1 + 1;
    lVar3 = lVar3 + 8;
    pauVar2 = pauVar2 + 1;
    input = input + 1;
  }
  if (verbose == 0) {
    return 1;
  }
  puts("failed");
  return 1;
}

Assistant:

int mbedtls_md5_self_test( int verbose )
{
    int i, ret = 0;
    unsigned char md5sum[16];

    for( i = 0; i < 7; i++ )
    {
        if( verbose != 0 )
            mbedtls_printf( "  MD5 test #%d: ", i + 1 );

        ret = mbedtls_md5_ret( md5_test_buf[i], md5_test_buflen[i], md5sum );
        if( ret != 0 )
            goto fail;

        if( memcmp( md5sum, md5_test_sum[i], 16 ) != 0 )
        {
            ret = 1;
            goto fail;
        }

        if( verbose != 0 )
            mbedtls_printf( "passed\n" );
    }

    if( verbose != 0 )
        mbedtls_printf( "\n" );

    return( 0 );

fail:
    if( verbose != 0 )
        mbedtls_printf( "failed\n" );

    return( ret );
}